

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

void invdisp_nothing(char *hdr,char *txt)

{
  nh_menuitem *_item_;
  nh_menuitem items [3];
  nh_menuitem local_348;
  undefined8 local_23c;
  undefined1 local_234;
  undefined2 local_134;
  undefined1 local_132;
  undefined8 local_130;
  char local_128 [256];
  undefined2 local_28;
  undefined1 local_26;
  
  local_348.id = 0;
  local_348.role = MI_HEADING;
  local_348.accel = '\0';
  local_348.group_accel = '\0';
  local_348.selected = '\0';
  strcpy(local_348.caption,hdr);
  local_23c = 0x100000000;
  local_134 = 0;
  local_132 = 0;
  local_234 = 0;
  local_130 = 0x100000000;
  local_28 = 0;
  local_26 = 0;
  strcpy(local_128,txt);
  display_menu(&local_348,3,(char *)0x0,0,(int *)0x0);
  return;
}

Assistant:

static void invdisp_nothing(const char *hdr, const char *txt)
{
	struct nh_menuitem items[3];
	
	set_menuitem(&items[0], 0, MI_HEADING, hdr, 0, FALSE);
	set_menuitem(&items[1], 0, MI_NORMAL, "", 0, FALSE);
	set_menuitem(&items[2], 0, MI_NORMAL, txt, 0, FALSE);
	
	display_menu(items, 3, NULL, PICK_NONE, NULL);
	
	return;
}